

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::addData(Group *this,uint lgSize)

{
  size_t sVar1;
  NullableValue<unsigned_int> location;
  DataLocation *pDVar2;
  NullableValue<unsigned_int> *pNVar3;
  uint *puVar4;
  DataLocationUsage *this_00;
  Group *group;
  uint *puVar5;
  ulong uVar6;
  uint result;
  uint *result_1;
  NullableValue<unsigned_int> local_80;
  NullableValue<unsigned_int> _result504;
  uint i_1;
  uint *best;
  uint *_best495;
  uint *hole;
  NullableValue<unsigned_int> local_50;
  NullableValue<unsigned_int> _hole487;
  DataLocationUsage *usage;
  uint local_30 [2];
  uint i;
  Maybe<unsigned_int> bestLocation;
  uint bestSize;
  uint lgSize_local;
  Group *this_local;
  
  bestLocation.ptr.field_1 = (anon_union_4_1_a8c68091_for_NullableValue<unsigned_int>_2)lgSize;
  addMember(this);
  bestLocation.ptr._0_4_ = kj::MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
  kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)&i);
  for (local_30[0] = 0; uVar6 = (ulong)local_30[0],
      sVar1 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::size
                        (&this->parent->dataLocations), uVar6 < sVar1; local_30[0] = local_30[0] + 1
      ) {
    sVar1 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
            size(&this->parentDataLocationUsage);
    if (sVar1 == local_30[0]) {
      kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::add<>
                (&this->parentDataLocationUsage);
    }
    location = (NullableValue<unsigned_int>)
               kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
               operator[](&this->parentDataLocationUsage,(ulong)local_30[0]);
    _hole487 = location;
    pDVar2 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::
             operator[](&this->parent->dataLocations,(ulong)local_30[0]);
    DataLocationUsage::smallestHoleAtLeast
              ((DataLocationUsage *)&hole,(DataLocation *)location,(uint)pDVar2);
    pNVar3 = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&hole);
    kj::_::NullableValue<unsigned_int>::NullableValue(&local_50,pNVar3);
    kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&hole);
    puVar4 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_50);
    if ((puVar4 != (uint *)0x0) &&
       (puVar4 = kj::_::NullableValue<unsigned_int>::operator*(&local_50),
       *puVar4 < (uint)bestLocation.ptr._0_4_)) {
      bestLocation.ptr._0_4_ = *puVar4;
      kj::Maybe<unsigned_int>::operator=((Maybe<unsigned_int> *)&i,local_30);
    }
    kj::_::NullableValue<unsigned_int>::~NullableValue(&local_50);
  }
  puVar4 = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&i);
  if (puVar4 == (uint *)0x0) {
    _result504.isSet = false;
    _result504._1_3_ = 0;
    for (; uVar6 = (ulong)(uint)_result504._0_4_,
        sVar1 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::size
                          (&this->parent->dataLocations), uVar6 < sVar1;
        _result504._0_4_ = _result504._0_4_ + 1) {
      group = (Group *)kj::
                       Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                       ::operator[](&this->parentDataLocationUsage,(ulong)(uint)_result504._0_4_);
      pDVar2 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::
               operator[](&this->parent->dataLocations,(ulong)(uint)_result504._0_4_);
      DataLocationUsage::tryAllocateByExpanding
                ((DataLocationUsage *)&result_1,group,(DataLocation *)this,(uint)pDVar2);
      pNVar3 = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&result_1);
      kj::_::NullableValue<unsigned_int>::NullableValue(&local_80,pNVar3);
      kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&result_1);
      puVar4 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_80);
      if (puVar4 != (uint *)0x0) {
        puVar5 = kj::_::NullableValue<unsigned_int>::operator*(&local_80);
        this_local._4_4_ = *puVar5;
      }
      _result504.field_1.value._1_3_ = 0;
      _result504.field_1.value._0_1_ = puVar4 != (uint *)0x0;
      kj::_::NullableValue<unsigned_int>::~NullableValue(&local_80);
      if (_result504.field_1.value != 0) goto LAB_006c94e9;
    }
    this_local._4_4_ = Union::addNewDataLocation(this->parent,bestLocation.ptr.field_1.value);
    kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
    add<unsigned_int&>(&this->parentDataLocationUsage,&bestLocation.ptr.field_1.value);
    _result504.field_1.value = 1;
  }
  else {
    this_00 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
              operator[](&this->parentDataLocationUsage,(ulong)*puVar4);
    pDVar2 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::
             operator[](&this->parent->dataLocations,(ulong)*puVar4);
    this_local._4_4_ =
         DataLocationUsage::allocateFromHole(this_00,this,pDVar2,bestLocation.ptr.field_1.value);
    _result504.field_1.value = 1;
  }
LAB_006c94e9:
  kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&i);
  return this_local._4_4_;
}

Assistant:

uint addData(uint lgSize) override {
      addMember();

      uint bestSize = kj::maxValue;
      kj::Maybe<uint> bestLocation = kj::none;

      for (uint i = 0; i < parent.dataLocations.size(); i++) {
        // If we haven't seen this DataLocation yet, add a corresponding DataLocationUsage.
        if (parentDataLocationUsage.size() == i) {
          parentDataLocationUsage.add();
        }

        auto& usage = parentDataLocationUsage[i];
        KJ_IF_SOME(hole, usage.smallestHoleAtLeast(parent.dataLocations[i], lgSize)) {
          if (hole < bestSize) {
            bestSize = hole;
            bestLocation = i;
          }
        }
      }

      KJ_IF_SOME(best, bestLocation) {
        return parentDataLocationUsage[best].allocateFromHole(
            *this, parent.dataLocations[best], lgSize);
      }

      // There are no holes at all in the union big enough to fit this field.  Go back through all
      // of the locations and attempt to expand them to fit.
      for (uint i = 0; i < parent.dataLocations.size(); i++) {
        KJ_IF_SOME(result, parentDataLocationUsage[i].tryAllocateByExpanding(
            *this, parent.dataLocations[i], lgSize)) {
          return result;
        }
      }

      // Couldn't find any space in the existing locations, so add a new one.
      uint result = parent.addNewDataLocation(lgSize);
      parentDataLocationUsage.add(lgSize);
      return result;
    }